

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

bool __thiscall QSqlError::operator!=(QSqlError *this,QSqlError *other)

{
  QSqlErrorPrivate *pQVar1;
  QSqlErrorPrivate *pQVar2;
  long lVar3;
  byte bVar4;
  QStringView QVar5;
  QStringView QVar6;
  
  pQVar1 = (this->d).d.ptr;
  pQVar2 = (other->d).d.ptr;
  bVar4 = true;
  if ((pQVar1->errorType == pQVar2->errorType) &&
     (lVar3 = (pQVar1->errorCode).d.size, lVar3 == (pQVar2->errorCode).d.size)) {
    QVar5.m_data = (pQVar1->errorCode).d.ptr;
    QVar5.m_size = lVar3;
    QVar6.m_data = (pQVar2->errorCode).d.ptr;
    QVar6.m_size = lVar3;
    bVar4 = QtPrivate::equalStrings(QVar5,QVar6);
    bVar4 = bVar4 ^ 1;
  }
  return (bool)bVar4;
}

Assistant:

constexpr P get() const noexcept { return ptr; }